

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

bool __thiscall
QTest::TestMethods::invokeTest
          (TestMethods *this,int index,QLatin1StringView tag,optional<QTest::WatchDog> *watchDog)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  long lVar3;
  QBenchmarkGlobalData *pQVar4;
  FILE *pFVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QTestTable *this_00;
  QTestData *pQVar11;
  char *pcVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar13;
  ulong extraout_RAX_01;
  undefined8 extraout_RAX_02;
  char16_t *pcVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  int i;
  int iVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QAnyStringView QVar25;
  QTestTable table;
  char member [512];
  int local_328;
  int local_324;
  int iVar26;
  QArrayData *local_2d8;
  longlong local_2d0;
  QArrayData *local_2c0;
  char *local_2b8;
  QTestTable local_2a8;
  QArrayData *local_2a0;
  char *local_298;
  qsizetype local_290;
  undefined1 local_288 [40];
  QString local_260;
  QStringBuilder<QLatin1String,_QLatin1String> local_248 [16];
  QString *local_48;
  undefined8 local_40;
  long local_38;
  
  pcVar14 = (char16_t *)tag.m_data;
  QVar21.m_size = tag.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_288._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_288._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_288._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_288._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBenchmarkTestMethodData::QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_288);
  QBenchmarkTestMethodData::current = (QBenchmarkTestMethodData *)local_288;
  if ((ulong)(long)index <
      (ulong)((long)(this->m_methods).super__Vector_base<QMetaMethod,_std::allocator<QMetaMethod>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_methods).super__Vector_base<QMetaMethod,_std::allocator<QMetaMethod>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    QMetaMethod::name();
    local_248[0].a.m_size = local_290;
    local_248[0].a.m_data = local_298;
    local_248[0].b.m_size = 2;
    local_248[0].b.m_data = "()";
    QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>(&local_260,local_248);
    pQVar4 = QBenchmarkGlobalData::current;
    pQVar1 = &((QBenchmarkGlobalData::current->context).slotName.d.d)->super_QArrayData;
    (QBenchmarkGlobalData::current->context).slotName.d.d = local_260.d.d;
    pcVar2 = (pQVar4->context).slotName.d.ptr;
    (pQVar4->context).slotName.d.ptr = local_260.d.ptr;
    uVar19 = (pQVar4->context).slotName.d.size;
    (pQVar4->context).slotName.d.size = local_260.d.size;
    local_260.d.d = (Data *)pQVar1;
    local_260.d.ptr = pcVar2;
    local_260.d.size = uVar19;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    memset(local_248,0xaa,0x200);
    local_2a8.d = (QTestTablePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QTestTable::QTestTable(&local_2a8);
    pcVar17 = local_298;
    if (local_298 == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    QTestResult::setCurrentTestFunction(pcVar17);
    this_00 = QTestTable::globalTestTable();
    iVar8 = QTestTable::dataCount(this_00);
    bVar20 = iVar8 == 0;
    iVar10 = 1;
    if (1 < iVar8) {
      iVar10 = iVar8;
    }
    pcVar17 = (char *)0x0;
    local_328 = 0;
    do {
      bVar6 = QTestTable::isEmpty(this_00);
      if (!bVar6) {
        pQVar11 = QTestTable::testData(this_00,local_328);
        QTestResult::setCurrentGlobalTestData(pQVar11);
      }
      if (local_328 == 0) {
        pcVar15 = local_298;
        if (local_298 == (char *)0x0) {
          pcVar15 = (char *)&QByteArray::_empty;
        }
        snprintf((char *)local_248,0x200,"%s_data()",pcVar15);
        if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
            super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
            super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
          WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionEnd);
        }
        invokeTestMethodIfExists((char *)local_248,currentTestObject);
        if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
            super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
            super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
          WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionStart);
        }
        bVar6 = QTestResult::skipCurrentTest();
        if (bVar6) break;
      }
      iVar9 = QTestTable::dataCount(&local_2a8);
      iVar18 = 1;
      if (1 < iVar9) {
        iVar18 = iVar9;
      }
      local_324 = 0;
      do {
        QTestResult::setSkipCurrentTest(false);
        iVar26 = iVar8;
        QTestResult::setBlacklistCurrentTest(false);
        if (iVar9 == 0) {
LAB_0012e00c:
          pcVar15 = (char *)0x0;
          uVar19 = 0;
        }
        else {
          pQVar11 = QTestTable::testData(&local_2a8,local_324);
          pcVar15 = QTestData::dataTag(pQVar11);
          if (pcVar15 == (char *)0x0) goto LAB_0012e00c;
          uVar19 = 0xffffffffffffffff;
          do {
            lVar3 = uVar19 + 1;
            uVar19 = uVar19 + 1;
          } while (pcVar15[lVar3] != '\0');
        }
        if (iVar8 == 0) {
LAB_0012e046:
          pcVar12 = (char *)0x0;
          uVar16 = 0;
          iVar8 = iVar26;
        }
        else {
          pQVar11 = QTestTable::testData(this_00,local_328);
          pcVar12 = QTestData::dataTag(pQVar11);
          if (pcVar12 == (char *)0x0) goto LAB_0012e046;
          uVar16 = 0xffffffffffffffff;
          do {
            lVar3 = uVar16 + 1;
            uVar16 = uVar16 + 1;
            iVar8 = iVar26;
          } while (pcVar12[lVar3] != '\0');
        }
        iVar26 = iVar8;
        if ((((QVar21.m_size == 0) ||
             ((uVar19 == QVar21.m_size &&
              (QVar21.m_data = pcVar15, cVar7 = QtPrivate::equalStrings(tag,QVar21), iVar26 = iVar8,
              cVar7 != '\0')))) ||
            ((uVar16 == QVar21.m_size &&
             (QVar22.m_data = pcVar12, QVar22.m_size = QVar21.m_size,
             cVar7 = QtPrivate::equalStrings(tag,QVar22), iVar26 = iVar8, cVar7 != '\0')))) ||
           ((((QVar23.m_data = pcVar12, QVar23.m_size = uVar16,
              cVar7 = QtPrivate::startsWith(tag,QVar23,CaseSensitive), cVar7 != '\0' &&
              (QVar24.m_data = pcVar15, QVar24.m_size = uVar19,
              cVar7 = QtPrivate::endsWith(tag,QVar24,CaseSensitive), cVar7 != '\0')) &&
             (uVar19 + uVar16 + 1 == QVar21.m_size)) &&
            (iVar26 = iVar8, *(char *)((long)pcVar14 + uVar16) == ':')))) {
          iVar8 = iVar26;
          if (iVar9 != 0) {
            pQVar11 = QTestTable::testData(&local_2a8,local_324);
            QTestData::dataTag(pQVar11);
          }
          if (iVar26 != 0) {
            pQVar11 = QTestTable::testData(this_00,local_328);
            QTestData::dataTag(pQVar11);
          }
          bVar6 = QTestPrivate::checkBlackLists
                            (pcVar17,(char *)CONCAT44(iVar18,index),(char *)CONCAT44(iVar10,iVar8));
          if ((bVar6) && (QTestResult::setBlacklistCurrentTest(true), skipBlacklisted == '\x01')) {
            QTestResult::addSkip
                      ("Skipping blacklisted test since -skipblacklisted option is set.",(char *)0x0
                       ,0);
            QTestResult::setSkipCurrentTest(true);
            QTestResult::finishedCurrentTestData();
            QTestResult::finishedCurrentTestDataCleanup();
            uVar13 = extraout_RAX;
          }
          else {
            if (local_324 < iVar9) {
              pQVar11 = QTestTable::testData(&local_2a8,local_324);
            }
            else {
              pQVar11 = (QTestData *)0x0;
            }
            QTestResult::setCurrentTestData(pQVar11);
            lastMouseTimestamp = lastMouseTimestamp + 500;
            QTestPrivate::qtestMouseButtons = 0;
            if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
                super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
                super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
              WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionEnd);
            }
            invokeTestOnData(this,index);
            if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
                super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
                super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
              WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionStart);
            }
            QTestResult::setCurrentTestData((QTestData *)0x0);
            uVar13 = extraout_RAX_00;
          }
          pcVar17 = (char *)CONCAT71((int7)((ulong)uVar13 >> 8),1);
          if (bVar20 && QVar21.m_size != 0) break;
        }
        local_324 = local_324 + 1;
      } while (local_324 != iVar18);
      QTestResult::setCurrentGlobalTestData((QTestData *)0x0);
      local_328 = local_328 + 1;
    } while (local_328 != iVar10);
    if (QVar21.m_size != 0 && ((ulong)pcVar17 & 1) == 0) {
      fprintf(_stderr,"Unknown testdata for function %s(): \'%s\'\n",local_298,pcVar14);
      iVar10 = QTestTable::dataCount(&local_2a8);
      invokeTest();
      if ((extraout_RAX_01 & 1) == 0) {
        iVar8 = 0;
        do {
          pFVar5 = _stderr;
          pQVar11 = QTestTable::testData(&local_2a8,iVar8);
          pcVar17 = QTestData::dataTag(pQVar11);
          fprintf(pFVar5,"\t%s\n",pcVar17);
          iVar8 = iVar8 + 1;
        } while (iVar10 != iVar8);
      }
      iVar8 = QTestTable::dataCount(this_00);
      if ((iVar8 != 0) && (fputs("Available global data tags:\n",_stderr), 0 < iVar8)) {
        iVar18 = 0;
        do {
          pFVar5 = _stderr;
          pQVar11 = QTestTable::testData(this_00,iVar18);
          pcVar17 = QTestData::dataTag(pQVar11);
          fprintf(pFVar5,"\t%s\n",pcVar17);
          iVar18 = iVar18 + 1;
        } while (iVar8 != iVar18);
      }
      if (iVar8 == 0 && iVar10 == 0) {
        invokeTest();
      }
      local_260.d.size = QVar21.m_size | 0x4000000000000000;
      local_260.d.d = (Data *)CONCAT71(local_260.d.d._1_7_,1);
      local_48 = &local_260;
      local_40 = 0;
      QVar25.m_size = (size_t)"Data tag not found: %1";
      QVar25.field_0.m_data = &local_2d8;
      local_260.d.ptr = pcVar14;
      QtPrivate::argToQString(QVar25,0x4000000000000016,(ArgBase **)0x1);
      QString::toLocal8Bit_helper((QChar *)&local_2c0,local_2d0);
      if (local_2b8 == (char *)0x0) {
        local_2b8 = (char *)&QByteArray::_empty;
      }
      QTestResult::addFailure(local_2b8,(char *)0x0,0);
      if (local_2c0 != (QArrayData *)0x0) {
        LOCK();
        (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_2c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_2c0,1,0x10);
        }
      }
      if (local_2d8 != (QArrayData *)0x0) {
        LOCK();
        (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_2d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_2d8,2,0x10);
        }
      }
    }
    QTestResult::finishedCurrentTestFunction();
    QTestResult::setSkipCurrentTest(false);
    QTestResult::setBlacklistCurrentTest(false);
    QTestTable::~QTestTable(&local_2a8);
    if (local_2a0 != (QArrayData *)0x0) {
      LOCK();
      (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2a0,1,0x10);
      }
    }
    QBenchmarkTestMethodData::~QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_288);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    invokeTest();
    if (local_2c0 != (QArrayData *)0x0) {
      LOCK();
      (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2c0,1,0x10);
      }
    }
    if (local_2d8 != (QArrayData *)0x0) {
      LOCK();
      (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2d8,2,0x10);
      }
    }
    QTestTable::~QTestTable(&local_2a8);
    if (local_2a0 != (QArrayData *)0x0) {
      LOCK();
      (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2a0,1,0x10);
      }
    }
    QBenchmarkTestMethodData::~QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_288);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX_02);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool TestMethods::invokeTest(int index, QLatin1StringView tag, std::optional<WatchDog> &watchDog) const
{
    QBenchmarkTestMethodData benchmarkData;
    QBenchmarkTestMethodData::current = &benchmarkData;

    const QByteArray &name = m_methods[index].name();
    QBenchmarkGlobalData::current->context.slotName = QLatin1StringView(name) + "()"_L1;

    char member[512];
    QTestTable table;

    QTestResult::setCurrentTestFunction(name.constData());

    const QTestTable *gTable = QTestTable::globalTestTable();
    const int globalDataCount = gTable->dataCount();
    int curGlobalDataIndex = 0;
    const auto globalDataTag = [gTable, globalDataCount](int index) {
        return globalDataCount ? gTable->testData(index)->dataTag() : nullptr;
    };

    const auto dataTagMatches = [](QLatin1StringView tag, QLatin1StringView local,
                                   QLatin1StringView global) {
        if (tag.isEmpty()) // No tag specified => run all data sets for this function
            return true;
        if (tag == local || tag == global) // Equal to either => run it
            return true;
        // Also allow global:local as a match:
        return tag.startsWith(global) && tag.endsWith(local) &&
               tag.size() == global.size() + 1 + local.size() &&
               tag[global.size()] == ':';
    };
    bool foundFunction = false;
    bool blacklisted = false;

    /* For each entry in the global data table, do: */
    do {
        if (!gTable->isEmpty())
            QTestResult::setCurrentGlobalTestData(gTable->testData(curGlobalDataIndex));

        if (curGlobalDataIndex == 0) {
            std::snprintf(member, 512, "%s_data()", name.constData());
            runWithWatchdog(watchDog, [&member] {
                invokeTestMethodIfExists(member);
            });
            if (QTestResult::skipCurrentTest())
                break;
        }

        int curDataIndex = 0;
        const int dataCount = table.dataCount();
        const auto dataTag = [&table, dataCount](int index) {
            return dataCount ? table.testData(index)->dataTag() : nullptr;
        };

        /* For each entry in this test's data table, do: */
        do {
            QTestResult::setSkipCurrentTest(false);
            QTestResult::setBlacklistCurrentTest(false);
            if (dataTagMatches(tag, QLatin1StringView(dataTag(curDataIndex)),
                               QLatin1StringView(globalDataTag(curGlobalDataIndex)))) {
                foundFunction = true;
                blacklisted = QTestPrivate::checkBlackLists(name.constData(), dataTag(curDataIndex),
                                                            globalDataTag(curGlobalDataIndex));
                if (blacklisted)
                    QTestResult::setBlacklistCurrentTest(true);

                if (blacklisted && skipBlacklisted) {
                    QTest::qSkip("Skipping blacklisted test since -skipblacklisted option is set.",
                                  NULL, 0);
                    QTestResult::finishedCurrentTestData();
                    QTestResult::finishedCurrentTestDataCleanup();
                } else {
                    QTestDataSetter s(
                        curDataIndex >= dataCount ? nullptr : table.testData(curDataIndex));

                    QTestPrivate::qtestMouseButtons = Qt::NoButton;

                    // Maintain at least 500ms mouse event timestamps between each test function
                    // call
                    QTest::lastMouseTimestamp += 500;

                    runWithWatchdog(watchDog, [this, index] {
                        invokeTestOnData(index);
                    });
                }

                if (!tag.isEmpty() && !globalDataCount)
                    break;
            }
            ++curDataIndex;
        } while (curDataIndex < dataCount);

        QTestResult::setCurrentGlobalTestData(nullptr);
        ++curGlobalDataIndex;
    } while (curGlobalDataIndex < globalDataCount);

    if (!tag.isEmpty() && !foundFunction) {
        printUnknownDataTagError(QLatin1StringView(name), tag, table, *gTable);
        QTestResult::addFailure(qPrintable("Data tag not found: %1"_L1.arg(tag)));
    }
    QTestResult::finishedCurrentTestFunction();
    QTestResult::setSkipCurrentTest(false);
    QTestResult::setBlacklistCurrentTest(false);

    return true;
}